

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::GPUShaderFP64Test2::prepareTestShader
          (GPUShaderFP64Test2 *this,GLchar *stage_specific_layout,GLchar *uniform_definitions,
          GLchar *in_variable_definitions,GLchar *out_variable_definitions,
          GLchar *uniform_verification,GLchar *stage_specific_main_body,string *out_source_code)

{
  size_t local_60;
  string local_58;
  GLchar *local_38;
  
  local_38 = uniform_verification;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             "#version 400 core\n\nprecision highp float;\n\nSTAGE_SPECIFIC_LAYOUTUNIFORM_DEFINITIONSIN_VARIABLE_DEFINITIONOUT_VARIABLE_DEFINITION\nvoid main()\n{\nUNIFORM_VERIFICATIONSTAGE_SPECIFIC_MAIN_BODY}\n\n"
             ,(allocator<char> *)&local_60);
  local_60 = 0;
  Utils::replaceToken("STAGE_SPECIFIC_LAYOUT",&local_60,stage_specific_layout,&local_58);
  Utils::replaceToken("UNIFORM_DEFINITIONS",&local_60,uniform_definitions,&local_58);
  Utils::replaceToken("IN_VARIABLE_DEFINITION",&local_60,in_variable_definitions,&local_58);
  Utils::replaceToken("OUT_VARIABLE_DEFINITION",&local_60,out_variable_definitions,&local_58);
  Utils::replaceToken("UNIFORM_VERIFICATION",&local_60,local_38,&local_58);
  Utils::replaceToken("STAGE_SPECIFIC_MAIN_BODY",&local_60,stage_specific_main_body,&local_58);
  std::__cxx11::string::_M_assign((string *)out_source_code);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareTestShader(const glw::GLchar* stage_specific_layout,
										   const glw::GLchar* uniform_definitions,
										   const glw::GLchar* in_variable_definitions,
										   const glw::GLchar* out_variable_definitions,
										   const glw::GLchar* uniform_verification,
										   const glw::GLchar* stage_specific_main_body,
										   std::string&		  out_source_code) const
{
	/* Shader template */
	static const glw::GLchar* test_shader_template_code = "#version 400 core\n"
														  "\n"
														  "precision highp float;\n"
														  "\n"
														  "STAGE_SPECIFIC_LAYOUT"
														  "UNIFORM_DEFINITIONS"
														  "IN_VARIABLE_DEFINITION"
														  "OUT_VARIABLE_DEFINITION"
														  "\n"
														  "void main()\n"
														  "{\n"
														  "UNIFORM_VERIFICATION"
														  "STAGE_SPECIFIC_MAIN_BODY"
														  "}\n"
														  "\n";

	std::string string = test_shader_template_code;

	/* Tokens */
	static const glw::GLchar* body_token	= "STAGE_SPECIFIC_MAIN_BODY";
	static const glw::GLchar* in_var_token  = "IN_VARIABLE_DEFINITION";
	static const glw::GLchar* layout_token  = "STAGE_SPECIFIC_LAYOUT";
	static const glw::GLchar* out_var_token = "OUT_VARIABLE_DEFINITION";
	static const glw::GLchar* uni_def_token = "UNIFORM_DEFINITIONS";
	static const glw::GLchar* uni_ver_token = "UNIFORM_VERIFICATION";

	size_t search_position = 0;

	/* Replace tokens */
	Utils::replaceToken(layout_token, search_position, stage_specific_layout, string);
	Utils::replaceToken(uni_def_token, search_position, uniform_definitions, string);
	Utils::replaceToken(in_var_token, search_position, in_variable_definitions, string);
	Utils::replaceToken(out_var_token, search_position, out_variable_definitions, string);
	Utils::replaceToken(uni_ver_token, search_position, uniform_verification, string);
	Utils::replaceToken(body_token, search_position, stage_specific_main_body, string);

	/* Store resuls */
	out_source_code = string;
}